

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O2

void __thiscall tcu::x11::egl::WindowFactory::WindowFactory(WindowFactory *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"window",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"X11 Window",&local_4a);
  eglu::NativeWindowFactory::NativeWindowFactory
            (&this->super_NativeWindowFactory,&local_28,&local_48,
             CAPABILITY_GET_SCREEN_SIZE|CAPABILITY_SET_SURFACE_SIZE|CAPABILITY_GET_SURFACE_SIZE|
             CAPABILITY_CREATE_SURFACE_PLATFORM|CAPABILITY_CREATE_SURFACE_LEGACY);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_NativeWindowFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeWindowFactory_0070fc18;
  return;
}

Assistant:

WindowFactory::WindowFactory (void)
	: NativeWindowFactory ("window", "X11 Window", Window::CAPABILITIES)
{
}